

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> * __thiscall
CConnman::GetAddedNodeInfo
          (vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *__return_storage_ptr__,
          CConnman *this,bool include_connected)

{
  CAddress *__k;
  ConnectionType CVar1;
  long lVar2;
  pointer ppCVar3;
  CNode *pCVar4;
  DNSLookupFn dns_lookup_function;
  AddedNodeParams *addr;
  bool bVar5;
  uint16_t portDefault;
  mapped_type_conflict *pmVar6;
  mapped_type *this_00;
  iterator iVar7;
  iterator iVar8;
  undefined4 uVar9;
  undefined7 in_register_00000011;
  _List_node_base *p_Var10;
  _Base_ptr p_Var11;
  pointer ppCVar12;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffea0;
  list<AddedNodeParams,_std::allocator<AddedNodeParams>_> lAddresses;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock80;
  CService local_f0;
  undefined2 local_c8;
  string addrName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
  mapConnectedByName;
  map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
  mapConnected;
  
  uVar9 = (undefined4)CONCAT71(in_register_00000011,include_connected);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::list<AddedNodeParams,_std::allocator<AddedNodeParams>_>::list
            (&lAddresses,0,(allocator_type *)&criticalblock80);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock80,&this->m_added_nodes_mutex,"m_added_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xb18,false);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_added_node_params).
                    super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_added_node_params).
                   super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x28);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<AddedNodeParams_const*,std::back_insert_iterator<std::__cxx11::list<AddedNodeParams,std::allocator<AddedNodeParams>>>>
            ((this->m_added_node_params).
             super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->m_added_node_params).
             super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
             super__Vector_impl_data._M_finish,&lAddresses);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock80.super_unique_lock);
  mapConnected._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapConnected._M_t._M_impl.super__Rb_tree_header._M_header;
  mapConnected._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapConnected._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapConnected._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_header;
  mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapConnectedByName._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  mapConnected._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapConnected._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock81,&this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xb22,false);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar12 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar12 != ppCVar3; ppCVar12 = ppCVar12 + 1) {
    pCVar4 = *ppCVar12;
    __k = &pCVar4->addr;
    bVar5 = CNetAddr::IsValid((CNetAddr *)__k);
    if (bVar5) {
      CVar1 = pCVar4->m_conn_type;
      pmVar6 = std::
               map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
               ::operator[](&mapConnected,&__k->super_CService);
      *pmVar6 = CVar1 == INBOUND;
    }
    std::__cxx11::string::string((string *)&addrName,&pCVar4->m_addr_name);
    if (addrName._M_string_length != 0) {
      criticalblock80.super_unique_lock._M_device._0_1_ = pCVar4->m_conn_type == INBOUND;
      CService::CService((CService *)&criticalblock80.super_unique_lock._M_owns,&__k->super_CService
                        );
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
                ::operator[](&mapConnectedByName,&addrName);
      std::pair<bool,_CService>::operator=(this_00,(type)&criticalblock80);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                 &criticalblock80.super_unique_lock._M_owns);
    }
    std::__cxx11::string::~string((string *)&addrName);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock81.super_unique_lock);
  p_Var10 = (_List_node_base *)&lAddresses;
  do {
    p_Var10 = (((_List_base<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)&p_Var10->_M_next)
              ->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var10 == (_List_node_base *)&lAddresses) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
      ::~_Rb_tree(&mapConnectedByName._M_t);
      std::
      _Rb_tree<CService,_std::pair<const_CService,_bool>,_std::_Select1st<std::pair<const_CService,_bool>_>,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
      ::~_Rb_tree(&mapConnected._M_t);
      std::__cxx11::_List_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>::_M_clear
                (&lAddresses.super__List_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    addr = (AddedNodeParams *)(p_Var10 + 1);
    portDefault = GetDefaultPort(this,(string *)addr);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xfffffffffffffea0,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._4_4_ = uVar9;
    dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffe88;
    dns_lookup_function.super__Function_base._M_functor._8_8_ = __return_storage_ptr__;
    dns_lookup_function.super__Function_base._M_manager = (_Manager_type)this;
    dns_lookup_function._M_invoker = (_Invoker_type)in_stack_fffffffffffffea0;
    LookupNumeric((CService *)&criticalblock80,(string *)addr,portDefault,dns_lookup_function);
    MaybeFlipIPv6toCJDNS((CService *)&addrName,(CService *)&criticalblock80);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock80);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffea0);
    AddedNodeParams::AddedNodeParams((AddedNodeParams *)&criticalblock80,addr);
    CService::CService(&local_f0);
    local_c8._0_1_ = false;
    local_c8._1_1_ = false;
    bVar5 = CNetAddr::IsValid((CNetAddr *)&addrName);
    if (bVar5) {
      iVar7 = std::
              _Rb_tree<CService,_std::pair<const_CService,_bool>,_std::_Select1st<std::pair<const_CService,_bool>_>,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
              ::find(&mapConnected._M_t,(CService *)&addrName);
      if ((_Rb_tree_header *)iVar7._M_node != &mapConnected._M_t._M_impl.super__Rb_tree_header) {
        if ((char)uVar9 == '\0') goto LAB_0017f43f;
        CService::operator=(&local_f0,(CService *)&addrName);
        p_Var11 = (_Base_ptr)&iVar7._M_node[2]._M_parent;
LAB_0017f427:
        local_c8._1_1_ = *(bool *)&p_Var11->_M_color;
        local_c8._0_1_ = true;
      }
LAB_0017f432:
      std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::emplace_back<AddedNodeInfo>
                (__return_storage_ptr__,(AddedNodeInfo *)&criticalblock80);
    }
    else {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
              ::find(&mapConnectedByName._M_t,(key_type *)addr);
      if ((_Rb_tree_header *)iVar8._M_node == &mapConnectedByName._M_t._M_impl.super__Rb_tree_header
         ) goto LAB_0017f432;
      if ((char)uVar9 != '\0') {
        CService::operator=(&local_f0,(CService *)&iVar8._M_node[2]._M_parent);
        p_Var11 = iVar8._M_node + 2;
        goto LAB_0017f427;
      }
    }
LAB_0017f43f:
    AddedNodeInfo::~AddedNodeInfo((AddedNodeInfo *)&criticalblock80);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrName);
  } while( true );
}

Assistant:

std::vector<AddedNodeInfo> CConnman::GetAddedNodeInfo(bool include_connected) const
{
    std::vector<AddedNodeInfo> ret;

    std::list<AddedNodeParams> lAddresses(0);
    {
        LOCK(m_added_nodes_mutex);
        ret.reserve(m_added_node_params.size());
        std::copy(m_added_node_params.cbegin(), m_added_node_params.cend(), std::back_inserter(lAddresses));
    }


    // Build a map of all already connected addresses (by IP:port and by name) to inbound/outbound and resolved CService
    std::map<CService, bool> mapConnected;
    std::map<std::string, std::pair<bool, CService>> mapConnectedByName;
    {
        LOCK(m_nodes_mutex);
        for (const CNode* pnode : m_nodes) {
            if (pnode->addr.IsValid()) {
                mapConnected[pnode->addr] = pnode->IsInboundConn();
            }
            std::string addrName{pnode->m_addr_name};
            if (!addrName.empty()) {
                mapConnectedByName[std::move(addrName)] = std::make_pair(pnode->IsInboundConn(), static_cast<const CService&>(pnode->addr));
            }
        }
    }

    for (const auto& addr : lAddresses) {
        CService service{MaybeFlipIPv6toCJDNS(LookupNumeric(addr.m_added_node, GetDefaultPort(addr.m_added_node)))};
        AddedNodeInfo addedNode{addr, CService(), false, false};
        if (service.IsValid()) {
            // strAddNode is an IP:port
            auto it = mapConnected.find(service);
            if (it != mapConnected.end()) {
                if (!include_connected) {
                    continue;
                }
                addedNode.resolvedAddress = service;
                addedNode.fConnected = true;
                addedNode.fInbound = it->second;
            }
        } else {
            // strAddNode is a name
            auto it = mapConnectedByName.find(addr.m_added_node);
            if (it != mapConnectedByName.end()) {
                if (!include_connected) {
                    continue;
                }
                addedNode.resolvedAddress = it->second.second;
                addedNode.fConnected = true;
                addedNode.fInbound = it->second.first;
            }
        }
        ret.emplace_back(std::move(addedNode));
    }

    return ret;
}